

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegerCondition.hpp
# Opt level: O2

Status __thiscall
AO::BehaviorTree::Version_1::Details::IntegerCondition<int,_Agent,_short>::decide
          (IntegerCondition<int,_Agent,_short> *this,EntityPtr entity,short args)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = std::function<int_(Agent_*,_short)>::operator()(&this->function,entity,args);
  switch(this->condition) {
  case LessThan:
    bVar2 = this->target <= iVar1;
    break;
  case GreaterThan:
    bVar2 = iVar1 <= this->target;
    break;
  case LessOrEqualThan:
    bVar2 = this->target < iVar1;
    break;
  case GreaterOrEqualThan:
    bVar2 = iVar1 < this->target;
    break;
  case Equal:
    bVar2 = iVar1 != this->target;
    break;
  case NotEqual:
    bVar2 = iVar1 == this->target;
    break;
  default:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

Status decide(EntityPtr entity, Args...args) override final
					{
						IntegerType const result = function(entity, args...);
						switch (condition)
						{
						case ConditionTest::LessThan:
							return result < target ? Status::Success : Status::Failure;
						case ConditionTest::GreaterThan:
							return result > target ? Status::Success : Status::Failure;
						case ConditionTest::LessOrEqualThan:
							return result <= target ? Status::Success : Status::Failure;
						case ConditionTest::GreaterOrEqualThan:
							return result >= target ? Status::Success : Status::Failure;
						case ConditionTest::Equal:
							return result == target ? Status::Success : Status::Failure;
						case ConditionTest::NotEqual:
							return result != target ? Status::Success : Status::Failure;
						default:
							return Status::Failure;
						}
					}